

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory * udata_findCachedData(char *path,UErrorCode *err)

{
  UHashtable *hash;
  char *key;
  void *pvVar1;
  UDataMemory *pUVar2;
  
  hash = udata_getHashTable(err);
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    key = findBasename(path);
    pUVar2 = (UDataMemory *)0x0;
    umtx_lock_63((UMutex *)0x0);
    pvVar1 = uhash_get_63(hash,key);
    umtx_unlock_63((UMutex *)0x0);
    if (pvVar1 != (void *)0x0) {
      pUVar2 = *(UDataMemory **)((long)pvVar1 + 8);
    }
  }
  else {
    pUVar2 = (UDataMemory *)0x0;
  }
  return pUVar2;
}

Assistant:

static UDataMemory *udata_findCachedData(const char *path, UErrorCode &err)
{
    UHashtable        *htable;
    UDataMemory       *retVal = NULL;
    DataCacheElement  *el;
    const char        *baseName;

    htable = udata_getHashTable(err);
    if (U_FAILURE(err)) {
        return NULL;
    }

    baseName = findBasename(path);   /* Cache remembers only the base name, not the full path. */
    umtx_lock(NULL);
    el = (DataCacheElement *)uhash_get(htable, baseName);
    umtx_unlock(NULL);
    if (el != NULL) {
        retVal = el->item;
    }
#ifdef UDATA_DEBUG
    fprintf(stderr, "Cache: [%s] -> %p\n", baseName, retVal);
#endif
    return retVal;
}